

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LispParser.cpp
# Opt level: O2

Expression * __thiscall Shell::LispParser::parse(LispParser *this)

{
  Expression *this_00;
  
  this_00 = (Expression *)Expression::operator_new(0x30);
  Expression::Expression(this_00,LIST);
  parse(this,&this_00->list);
  return this_00;
}

Assistant:

LispParser::Expression* LispParser::parse()
{
  Expression* result = new Expression(LIST);
  parse(&result->list);
  return result;
}